

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

ParseableFunctionInfo *
Js::ParseableFunctionInfo::New
          (ScriptContext *scriptContext,int nestedCount,LocalFunctionId functionId,
          Utf8SourceInfo *sourceInfo,char16 *displayName,uint displayNameLength,
          uint displayShortNameOffset,Attributes attributes,FunctionBodyFlags flags)

{
  Type TVar1;
  uint uVar2;
  uint uVar3;
  Type TVar4;
  code *pcVar5;
  bool bVar6;
  undefined4 *puVar7;
  SourceContextInfo *pSVar8;
  Recycler *alloc;
  ParseableFunctionInfo *this;
  uint functionNumber;
  undefined1 local_70 [8];
  TrackAllocData data;
  
  if (scriptContext->DeferredParsingThunk != JavascriptFunction::DeferredParsingThunk &&
      scriptContext->DeferredParsingThunk != ScriptContext::ProfileModeDeferredParsingThunk) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x6d4,
                                "(scriptContext->DeferredParsingThunk == Js::ScriptContext::ProfileModeDeferredParsingThunk || scriptContext->DeferredParsingThunk == Js::JavascriptFunction::DeferredParsingThunk)"
                                ,
                                "scriptContext->DeferredParsingThunk == ProfileDeferredParsingThunk || scriptContext->DeferredParsingThunk == DefaultDeferredParsingThunk"
                               );
    if (!bVar6) {
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar7 = 0;
  }
  functionNumber = scriptContext->threadContext->functionCount + 1;
  scriptContext->threadContext->functionCount = functionNumber;
  data._32_8_ = (ulong)displayNameLength;
  pSVar8 = Utf8SourceInfo::GetSourceContextInfo(sourceInfo);
  TVar4 = pSVar8->dwHostSourceContext;
  TVar1 = pSVar8->isHostDynamicDocument;
  bVar6 = Phases::IsEnabled((Phases *)&DAT_015d3490,DeferParsePhase);
  if ((TVar4 == 0xffffffffffffffff) || ((TVar1 & 1U) != 0)) {
    if (!bVar6) goto LAB_0076988f;
    Output::Print(L"Function was deferred from parsing - ID: %d; Display Name: %s; Utf8SourceInfo ID: %d; Source Length: %d;\n"
                  ,(ulong)functionNumber,displayName,(ulong)sourceInfo->m_sourceInfoId,
                  (ulong)sourceInfo->m_cchLength);
  }
  else {
    if (!bVar6) goto LAB_0076988f;
    uVar2 = sourceInfo->m_cchLength;
    uVar3 = sourceInfo->m_sourceInfoId;
    pSVar8 = Utf8SourceInfo::GetSourceContextInfo(sourceInfo);
    Output::Print(L"Function was deferred from parsing - ID: %d; Display Name: %s; Utf8SourceInfo ID: %d; Source Length: %d; Source Url:%s\n"
                  ,(ulong)functionNumber,displayName,(ulong)uVar3,(ulong)uVar2,
                  (pSVar8->field_5).field_0.url);
  }
  Output::Flush();
LAB_0076988f:
  local_70 = (undefined1  [8])&typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_2ab601b;
  data.filename._0_4_ = 0x6f3;
  alloc = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_70);
  this = (ParseableFunctionInfo *)new<Memory::Recycler>(0xb8,alloc,0x78130e);
  ParseableFunctionInfo
            (this,scriptContext->DeferredParsingThunk,nestedCount,functionId,sourceInfo,
             scriptContext,functionNumber,displayName,data.line,displayShortNameOffset,
             attributes | DeferredParse,flags);
  return this;
}

Assistant:

ParseableFunctionInfo* ParseableFunctionInfo::New(ScriptContext* scriptContext, int nestedCount,
        LocalFunctionId functionId, Utf8SourceInfo* sourceInfo, const char16* displayName, uint displayNameLength, uint displayShortNameOffset, FunctionInfo::Attributes attributes, FunctionBodyFlags flags)
    {
#if defined(ENABLE_SCRIPT_PROFILING) || defined(ENABLE_SCRIPT_DEBUGGING)
        Assert(
            scriptContext->DeferredParsingThunk == ProfileDeferredParsingThunk ||
            scriptContext->DeferredParsingThunk == DefaultDeferredParsingThunk);
#else
        Assert(scriptContext->DeferredParsingThunk == DefaultDeferredParsingThunk);
#endif

#ifdef PERF_COUNTERS
        PERF_COUNTER_INC(Code, DeferredFunction);
#endif
        uint newFunctionNumber = scriptContext->GetThreadContext()->NewFunctionNumber();
        if (!sourceInfo->GetSourceContextInfo()->IsDynamic())
        {
            PHASE_PRINT_TESTTRACE1(Js::DeferParsePhase, _u("Function was deferred from parsing - ID: %d; Display Name: %s; Utf8SourceInfo ID: %d; Source Length: %d; Source Url:%s\n"), newFunctionNumber, displayName, sourceInfo->GetSourceInfoId(), sourceInfo->GetCchLength(), sourceInfo->GetSourceContextInfo()->url);
        }
        else
        {
            PHASE_PRINT_TESTTRACE1(Js::DeferParsePhase, _u("Function was deferred from parsing - ID: %d; Display Name: %s; Utf8SourceInfo ID: %d; Source Length: %d;\n"), newFunctionNumber, displayName, sourceInfo->GetSourceInfoId(), sourceInfo->GetCchLength());
        }

        // When generating a new defer parse function, we always use a new function number
        return RecyclerNewWithBarrierFinalized(scriptContext->GetRecycler(),
            ParseableFunctionInfo,
            scriptContext->DeferredParsingThunk,
            nestedCount,
            functionId,
            sourceInfo,
            scriptContext,
            newFunctionNumber,
            displayName,
            displayNameLength,
            displayShortNameOffset,
            (FunctionInfo::Attributes)(attributes | FunctionInfo::Attributes::DeferredParse),
            flags);
    }